

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXR(float **out_rgba,int *width,int *height,char *filename,char **err)

{
  int iVar1;
  float *pfVar2;
  int local_10c4;
  int local_10c0;
  int i_1;
  int c;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int ret_1;
  int i;
  int ret;
  EXRImage exrImage;
  char **err_local;
  char *filename_local;
  int *height_local;
  int *width_local;
  float **out_rgba_local;
  
  if (out_rgba == (float **)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.\n";
    }
    out_rgba_local._4_4_ = -1;
  }
  else {
    exrImage._4192_8_ = err;
    InitEXRImage((EXRImage *)&i);
    out_rgba_local._4_4_ =
         ParseMultiChannelEXRHeaderFromFile((EXRImage *)&i,filename,(char **)exrImage._4192_8_);
    if (out_rgba_local._4_4_ == 0) {
      for (idxR = 0; idxR < exrImage.custom_attributes[0x7f].value._4_4_; idxR = idxR + 1) {
        if (*(int *)((long)exrImage.images + (long)idxR * 4) == 1) {
          exrImage.pixel_types[idxR] = 2;
        }
      }
      out_rgba_local._4_4_ =
           LoadMultiChannelEXRFromFile((EXRImage *)&i,filename,(char **)exrImage._4192_8_);
      if (out_rgba_local._4_4_ == 0) {
        idxB = -1;
        idxA = -1;
        c = -1;
        i_1 = -1;
        for (local_10c0 = 0; local_10c0 < exrImage.custom_attributes[0x7f].value._4_4_;
            local_10c0 = local_10c0 + 1) {
          iVar1 = strcmp(*(char **)(exrImage._4096_8_ + (long)local_10c0 * 8),"R");
          if (iVar1 == 0) {
            idxB = local_10c0;
          }
          else {
            iVar1 = strcmp(*(char **)(exrImage._4096_8_ + (long)local_10c0 * 8),"G");
            if (iVar1 == 0) {
              idxA = local_10c0;
            }
            else {
              iVar1 = strcmp(*(char **)(exrImage._4096_8_ + (long)local_10c0 * 8),"B");
              if (iVar1 == 0) {
                c = local_10c0;
              }
              else {
                iVar1 = strcmp(*(char **)(exrImage._4096_8_ + (long)local_10c0 * 8),"A");
                if (iVar1 == 0) {
                  i_1 = local_10c0;
                }
              }
            }
          }
        }
        if (idxB == -1) {
          if (exrImage._4192_8_ != 0) {
            *(char **)exrImage._4192_8_ = "R channel not found\n";
          }
          out_rgba_local._4_4_ = -1;
        }
        else if (idxA == -1) {
          if (exrImage._4192_8_ != 0) {
            *(char **)exrImage._4192_8_ = "G channel not found\n";
          }
          out_rgba_local._4_4_ = -1;
        }
        else if (c == -1) {
          if (exrImage._4192_8_ != 0) {
            *(char **)exrImage._4192_8_ = "B channel not found\n";
          }
          out_rgba_local._4_4_ = -1;
        }
        else {
          pfVar2 = (float *)malloc((long)(int)exrImage.requested_pixel_types * 0x10 *
                                   (long)exrImage.requested_pixel_types._4_4_);
          *out_rgba = pfVar2;
          for (local_10c4 = 0;
              local_10c4 <
              (int)exrImage.requested_pixel_types * exrImage.requested_pixel_types._4_4_;
              local_10c4 = local_10c4 + 1) {
            (*out_rgba)[local_10c4 << 2] =
                 *(float *)(exrImage.channel_names[idxB] + (long)local_10c4 * 4);
            (*out_rgba)[local_10c4 * 4 + 1] =
                 *(float *)(exrImage.channel_names[idxA] + (long)local_10c4 * 4);
            (*out_rgba)[local_10c4 * 4 + 2] =
                 *(float *)(exrImage.channel_names[c] + (long)local_10c4 * 4);
            if (i_1 < 1) {
              (*out_rgba)[local_10c4 * 4 + 3] = 1.0;
            }
            else {
              (*out_rgba)[local_10c4 * 4 + 3] =
                   *(float *)(exrImage.channel_names[i_1] + (long)local_10c4 * 4);
            }
          }
          *width = (int)exrImage.requested_pixel_types;
          *height = exrImage.requested_pixel_types._4_4_;
          out_rgba_local._4_4_ = 0;
        }
      }
    }
  }
  return out_rgba_local._4_4_;
}

Assistant:

int LoadEXR(float **out_rgba, int *width, int *height, const char *filename,
            const char **err) {

  if (out_rgba == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return -1;
  }

  EXRImage exrImage;
  InitEXRImage(&exrImage);

  {
    int ret = ParseMultiChannelEXRHeaderFromFile(&exrImage, filename, err);
    if (ret != 0) {
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exrImage.num_channels; i++) {
    if (exrImage.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exrImage.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  {
    int ret = LoadMultiChannelEXRFromFile(&exrImage, filename, err);
    if (ret != 0) {
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exrImage.num_channels; c++) {
    if (strcmp(exrImage.channel_names[c], "R") == 0) {
      idxR = c;
    } else if (strcmp(exrImage.channel_names[c], "G") == 0) {
      idxG = c;
    } else if (strcmp(exrImage.channel_names[c], "B") == 0) {
      idxB = c;
    } else if (strcmp(exrImage.channel_names[c], "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exrImage }
    return -1;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  (*out_rgba) =
      (float *)malloc(4 * sizeof(float) * exrImage.width * exrImage.height);
  for (int i = 0; i < exrImage.width * exrImage.height; i++) {
    (*out_rgba)[4 * i + 0] =
        reinterpret_cast<float **>(exrImage.images)[idxR][i];
    (*out_rgba)[4 * i + 1] =
        reinterpret_cast<float **>(exrImage.images)[idxG][i];
    (*out_rgba)[4 * i + 2] =
        reinterpret_cast<float **>(exrImage.images)[idxB][i];
    if (idxA > 0) {
      (*out_rgba)[4 * i + 3] =
          reinterpret_cast<float **>(exrImage.images)[idxA][i];
    } else {
      (*out_rgba)[4 * i + 3] = 1.0;
    }
  }

  (*width) = exrImage.width;
  (*height) = exrImage.height;

  // @todo { free exrImage }
  return 0;
}